

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

String * __thiscall
Console::Prompt::Private::getLine(String *__return_storage_ptr__,Private *this,String *prompt)

{
  byte bVar1;
  int iVar2;
  uint *puVar3;
  conchar *data;
  code *pcVar4;
  uint __i;
  int iVar5;
  usize uVar6;
  long lVar7;
  int *piVar8;
  ssize_t sVar9;
  timeval tv;
  fd_set fdr;
  char buffer_1 [64];
  
  if (this->valid != false) {
    redirectPendingData(this);
    enableTerminalRawMode(this);
    saveCursorPosition(this);
    stringToConcharArray(this,prompt,&this->prompt);
    puVar3 = (this->input)._begin.item;
    (this->historyPos).item = (this->history)._end.item;
    this->historyRemoveLast = false;
    if (puVar3 != (uint *)0x0) {
      (this->input)._end.item = puVar3;
    }
    this->inputComplete = false;
    this->caretPos = 0;
    fdr.fds_bits[0] = (__fd_mask)&String::emptyData;
    promptWrite(this,0,(String *)&fdr);
    String::~String((String *)&fdr);
LAB_0010893d:
    do {
      do {
        if ((this->bufferedInput).bufferStart == (this->bufferedInput).bufferEnd) {
          bVar1 = this->inputComplete;
        }
        else {
          uVar6 = readChar(this,(char *)&fdr);
          handleInput(this,(char *)&fdr,uVar6);
          bVar1 = this->inputComplete;
          if ((bool)bVar1 == false) goto LAB_0010893d;
        }
        if ((bVar1 & 1) != 0) {
          promptClear(this);
          restoreCursorPosition(this);
          flushConsole(this);
          restoreTerminalMode(this);
          __return_storage_ptr__->data = &String::emptyData.super_Data;
          data = (this->input)._begin.item;
          concharArrayToString
                    (this,data,(long)(this->input)._end.item - (long)data >> 2,
                     __return_storage_ptr__);
          if (this->historyRemoveLast == true) {
            List<String>::removeBack(&this->history);
          }
          if (__return_storage_ptr__->data->len == 0) {
            return __return_storage_ptr__;
          }
          List<String>::append(&this->history,__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 1) {
          fdr.fds_bits[lVar7] = 0;
        }
        iVar5 = this->stdoutRead;
        fdr.fds_bits[iVar5 / 0x40] = fdr.fds_bits[iVar5 / 0x40] | 1L << ((byte)iVar5 & 0x3f);
        iVar2 = this->stderrRead;
        fdr.fds_bits[iVar2 / 0x40] = fdr.fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f);
        fdr.fds_bits[0] = fdr.fds_bits[0] | 1;
        fdr.fds_bits[resizeEventFd / 0x40] =
             fdr.fds_bits[resizeEventFd / 0x40] | 1L << ((byte)resizeEventFd & 0x3f);
        if (iVar5 < iVar2) {
          iVar5 = iVar2;
        }
        if (iVar5 < resizeEventFd) {
          iVar5 = resizeEventFd;
        }
        tv.tv_sec = 1000000;
        tv.tv_usec = 0;
        flushConsole(this);
        iVar5 = select(iVar5 + 1,(fd_set *)&fdr,(fd_set *)0x0,(fd_set *)0x0,(timeval *)&tv);
      } while (iVar5 == 0);
      if (iVar5 != -1) {
        iVar5 = this->stdoutRead;
        if (((ulong)fdr.fds_bits[iVar5 / 0x40] >> ((long)iVar5 % 0x40 & 0x3fU) & 1) != 0) {
          handleOutput(this,iVar5,originalStdout);
        }
        iVar5 = this->stderrRead;
        if (((ulong)fdr.fds_bits[iVar5 / 0x40] >> ((long)iVar5 % 0x40 & 0x3fU) & 1) != 0) {
          handleOutput(this,iVar5,this->originalStderr);
        }
        if ((fdr.fds_bits[0] & 1U) != 0) {
          uVar6 = readChar(this,buffer_1);
          handleInput(this,buffer_1,uVar6);
        }
        if ((((ulong)fdr.fds_bits[resizeEventFd / 0x40] >> ((long)resizeEventFd % 0x40 & 0x3fU) & 1)
             != 0) && (sVar9 = read(resizeEventFd,buffer_1,8), sVar9 == 8)) {
          uVar6 = getScreenWidth(this);
          handleResize(this,uVar6);
        }
        goto LAB_0010893d;
      }
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    iVar5 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Console.cpp"
                          ,0x309,"false");
    if (iVar5 != 0) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
  }
  __return_storage_ptr__->data = &String::emptyData.super_Data;
  return __return_storage_ptr__;
}

Assistant:

String getLine(const String& prompt)
  {
    if(!valid)
    {
      // todo: print std and read line from stdin 
      return String();
    }

    // write pending stdout data
    redirectPendingData();

    //
    enableTerminalRawMode();
    saveCursorPosition();

    // initialize and write prompt
    stringToConcharArray(prompt, this->prompt);
    historyPos = history.end();
    historyRemoveLast = false;
    input.clear();
    inputComplete = false;
    caretPos = 0;
    promptWrite();

#ifdef _MSC_VER
    // wait for io
    HANDLE hStdIn = GetStdHandle(STD_INPUT_HANDLE);
    HANDLE handles[] = {hStdIn, outOverlapped.hEvent, errOverlapped.hEvent};
    while(!inputComplete)
    {
      DWORD dw = WaitForMultipleObjects(3, handles, FALSE, INFINITE);
      switch(dw)
      {
      case WAIT_OBJECT_0:
        {
          INPUT_RECORD records[1];
          DWORD read;
          VERIFY(ReadConsoleInput(hStdIn, records, 1, &read));
          usize keyEvents = 0;
          for(DWORD i = 0; i < read; ++i)
            switch(records[i].EventType)
            {
            case WINDOW_BUFFER_SIZE_EVENT:
              handleResize(records[i].Event.WindowBufferSizeEvent.dwSize.X);
              break;
            case KEY_EVENT:
              {
                const KEY_EVENT_RECORD& keyEvent = records[i].Event.KeyEvent;
                if(keyEvent.bKeyDown)
#ifdef _UNICODE
                  handleInput(keyEvent.uChar.UnicodeChar, keyEvent.wVirtualKeyCode);
#else
                  handleInput(keyEvent.uChar.AsciiChar, keyEvent.wVirtualKeyCode);
#endif
              }
              break;
            }
        }
        break;
      case WAIT_OBJECT_0 + 1:
        handleOutput(hStdOutRead, hOriginalStdOut, stdoutBuffer, sizeof(stdoutBuffer), outOverlapped);
        break;
      case WAIT_OBJECT_0 + 2:
        handleOutput(hStdErrRead, hOriginalStdErr, stderrBuffer, sizeof(stderrBuffer), errOverlapped);
        break;
      default:
        break;
      }
    }

#else
    for(;;)
    {
      while(!bufferedInput.isEmpty())
      {
        char buffer[64];
        usize len = readChar(buffer);
        handleInput(buffer, len);
        if(inputComplete)
          break;
      }
      if(inputComplete)
        break;

      fd_set fdr;
      FD_ZERO(&fdr);
      FD_SET(stdoutRead, &fdr);
      FD_SET(stderrRead, &fdr);
      FD_SET(STDIN_FILENO, &fdr);
      FD_SET(resizeEventFd, &fdr);
      int nfds = stdoutRead;
      if(stderrRead > nfds)
        nfds = stderrRead;
      if(resizeEventFd > nfds)
        nfds = resizeEventFd;
      timeval tv = {1000000, 0};
      flushConsole();
      switch(select(nfds + 1, &fdr, 0, 0, &tv))
      {
      case 0:
        continue;
      case -1:
        if(errno == EINTR)
          continue;
        ASSERT(false);
        return String();
      }
      if(FD_ISSET(stdoutRead, &fdr))
        handleOutput(stdoutRead, originalStdout);
      if(FD_ISSET(stderrRead, &fdr))
        handleOutput(stderrRead, originalStderr);
      if(FD_ISSET(STDIN_FILENO, &fdr))
      {
        char buffer[64];
        usize len = readChar(buffer);
        handleInput(buffer, len);
      }
      if(FD_ISSET(resizeEventFd, &fdr))
      {
        uint64 buffer;
        if(read(resizeEventFd, &buffer, sizeof(uint64)) == sizeof(uint64))
          handleResize(getScreenWidth());
      }
    }

#endif
    promptClear();
    restoreCursorPosition();
#ifndef _MSC_VER
    flushConsole();
#endif
    restoreTerminalMode();
    String result;
    concharArrayToString(input, input.size(), result);
    if(historyRemoveLast)
      history.removeBack();
    if(!result.isEmpty())
      history.append(result);
    return result;
  }